

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O2

vec4 __thiscall vera::Triangle::getColor(Triangle *this,vec3 *_barycenter)

{
  Material *pMVar1;
  vec<4,_float,_(glm::qualifier)0> *v;
  vec2 vVar2;
  bool bVar3;
  float fVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined4 uVar5;
  vec4 vVar6;
  vec<4,_float,_(glm::qualifier)0> vVar7;
  undefined8 local_98;
  vec<4,_float,_(glm::qualifier)0> local_88;
  undefined1 local_68 [8];
  undefined4 uStack_60;
  undefined4 uStack_5c;
  vec<4,_float,_(glm::qualifier)0> local_50;
  vec<4,_float,_(glm::qualifier)0> local_40;
  vec<4,_float,_(glm::qualifier)0> local_30;
  
  pMVar1 = this->material;
  if (pMVar1 != (Material *)0x0) {
    std::__cxx11::string::string((string *)&local_88,"diffuse",(allocator *)&local_50);
    bVar3 = Material::haveProperty(pMVar1,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    if (bVar3) {
      pMVar1 = this->material;
      if ((this->m_texCoords).
          super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->m_texCoords).
          super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string((string *)&local_88,"diffuse",(allocator *)&local_50);
        vVar6 = Material::getColor(pMVar1,(string *)&local_88);
        local_98 = vVar6._0_8_;
        uStack_60 = in_XMM1_Dc;
        local_68 = (undefined1  [8])vVar6._8_8_;
        uStack_5c = in_XMM1_Dd;
      }
      else {
        std::__cxx11::string::string((string *)&local_88,"diffuse",(allocator *)&local_40);
        vVar2 = getTexCoord(this,_barycenter);
        local_68._0_4_ = floorf(vVar2.field_0.x);
        local_68._4_4_ = extraout_XMM0_Db;
        uStack_60 = extraout_XMM0_Dc;
        uStack_5c = extraout_XMM0_Dd;
        local_98._4_4_ =
             (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)vVar2.field_1;
        fVar4 = floorf(local_98._4_4_);
        local_50.field_1.y = local_98._4_4_ - fVar4;
        local_50.field_0.x = vVar2.field_0.x - (float)local_68._0_4_;
        uVar5 = extraout_XMM0_Db_00;
        vVar6 = Material::getColor(pMVar1,(string *)&local_88,(vec2 *)&local_50);
        local_98 = vVar6._0_8_;
        uStack_60 = local_68._4_4_;
        local_68 = (undefined1  [8])vVar6._8_8_;
        uStack_5c = uVar5;
      }
      std::__cxx11::string::~string((string *)&local_88);
      goto LAB_00251c4d;
    }
  }
  v = (this->m_colors).
      super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start;
  if (v == (this->m_colors).
           super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
    local_98._0_4_ = 1.0;
    local_98._4_4_ = 1.0;
    local_68._0_4_ = local_98._0_4_;
    local_68._4_4_ = local_98._4_4_;
  }
  else {
    local_50 = glm::operator*(v,(_barycenter->field_0).x);
    local_40 = glm::operator*((this->m_colors).
                              super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1,(_barycenter->field_1).y
                             );
    local_88 = glm::operator+(&local_50,&local_40);
    local_30 = glm::operator*((this->m_colors).
                              super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 2,(_barycenter->field_2).z
                             );
    vVar7 = glm::operator+(&local_88,&local_30);
    local_68._0_4_ = vVar7.field_2;
    local_68._4_4_ = vVar7.field_3;
    local_98._0_4_ = vVar7.field_0;
    local_98._4_4_ = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)vVar7.field_1;
  }
LAB_00251c4d:
  vVar6.field_1.y = local_98._4_4_;
  vVar6.field_0 = local_98._0_4_;
  vVar6.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)local_68._4_4_;
  vVar6.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)local_68._0_4_;
  return vVar6;
}

Assistant:

glm::vec4 Triangle::getColor(const glm::vec3& _barycenter) const {
    if (material != nullptr) {
        if ( material->haveProperty("diffuse") ) {
            if (haveTexCoords())
                return material->getColor("diffuse", glm::fract( getTexCoord(_barycenter) ) );
            else
                return material->getColor("diffuse");
        }
    }

    if (haveColors())
        return  getColor(0) * _barycenter.x +
                getColor(1) * _barycenter.y +
                getColor(2) * _barycenter.z;
    else
        return glm::vec4(1.0f);
}